

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usprep.cpp
# Opt level: O2

int32_t hashEntry(UHashTok parm)

{
  UHashTok key;
  int32_t iVar1;
  int32_t iVar2;
  
  key = *(UHashTok *)((long)parm.pointer + 8);
  iVar1 = uhash_hashChars_63(*parm.pointer);
  iVar2 = uhash_hashChars_63(key);
  return iVar2 * 0x25 + iVar1;
}

Assistant:

static int32_t U_CALLCONV 
hashEntry(const UHashTok parm) {
    UStringPrepKey *b = (UStringPrepKey *)parm.pointer;
    UHashTok namekey, pathkey;
    namekey.pointer = b->name;
    pathkey.pointer = b->path;
    uint32_t unsignedHash = static_cast<uint32_t>(uhash_hashChars(namekey)) +
            37u * static_cast<uint32_t>(uhash_hashChars(pathkey));
    return static_cast<int32_t>(unsignedHash);
}